

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::setMaxCount(Picker *this,int max)

{
  QAbstractItemModel *pQVar1;
  uint uVar2;
  int iVar3;
  PickerPrivate *pPVar4;
  QModelIndex local_50;
  QMessageLogger local_38;
  uint local_14;
  Picker *pPStack_10;
  int max_local;
  Picker *this_local;
  
  local_14 = max;
  pPStack_10 = this;
  if (max < 0) {
    QMessageLogger::QMessageLogger(&local_38,(char *)0x0,0,(char *)0x0);
    QMessageLogger::warning
              ((char *)&local_38,"QtMWidgets::Picker::setMaxCount: Invalid count (%d) must be >= 0",
               (ulong)local_14);
  }
  else {
    iVar3 = count(this);
    if (max < iVar3) {
      pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      uVar2 = local_14;
      pQVar1 = pPVar4->model;
      iVar3 = count(this);
      iVar3 = iVar3 - local_14;
      pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,&pPVar4->root);
      (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,uVar2,iVar3,&local_50);
    }
    uVar2 = local_14;
    pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar4->maxCount = uVar2;
  }
  return;
}

Assistant:

void
Picker::setMaxCount( int max )
{
	if( max < 0 )
	{
		qWarning( "QtMWidgets::Picker::setMaxCount: Invalid count (%d) must be >= 0",
			max );
		return;
	}

	if( max < count() )
		d->model->removeRows( max, count() - max, d->root );

	d->maxCount = max;
}